

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

bool __thiscall
wasm::WasmBinaryBuilder::maybeVisitStringIterNext
          (WasmBinaryBuilder *this,Expression **out,uint32_t code)

{
  Expression *pEVar1;
  StringIterNext *this_00;
  
  if (code == 0xa1) {
    pEVar1 = popNonVoidExpression(this);
    this_00 = (StringIterNext *)MixedArena::allocSpace(&this->wasm->allocator,0x18,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)82>).super_Expression._id =
         StringIterNextId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)82>).super_Expression.type.id = 0;
    this_00->ref = pEVar1;
    StringIterNext::finalize(this_00);
    *out = (Expression *)this_00;
  }
  return code == 0xa1;
}

Assistant:

bool WasmBinaryBuilder::maybeVisitStringIterNext(Expression*& out,
                                                 uint32_t code) {
  if (code != BinaryConsts::StringViewIterNext) {
    return false;
  }
  auto* ref = popNonVoidExpression();
  out = Builder(wasm).makeStringIterNext(ref);
  return true;
}